

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O1

void __thiscall ArgumentParser::Instance::Parse<cmList>(Instance *this,cmList *args,size_t pos)

{
  pointer pbVar1;
  pointer pbVar2;
  string_view arg;
  
  pbVar1 = (args->Values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (args->Values).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    arg._M_str = (pbVar2->_M_dataplus)._M_p;
    arg._M_len = pbVar2->_M_string_length;
    Consume(this,pos,arg);
    pos = pos + 1;
  }
  FinishKeyword(this);
  return;
}

Assistant:

void Parse(Range const& args, std::size_t pos = 0)
  {
    for (cm::string_view arg : args) {
      this->Consume(pos++, arg);
    }
    this->FinishKeyword();
  }